

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  
  printOpenHeader(this,_name);
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam000000000017f660 = 0x2e2e2e2e2e2e2e;
    uRam000000000017f667 = 0x2e2e2e2e2e2e2e2e;
    _DAT_0017f650 = 0x2e2e2e2e2e2e2e2e;
    uRam000000000017f658 = 0x2e2e2e2e2e2e2e;
    DAT_0017f65f = 0x2e;
    _DAT_0017f640 = 0x2e2e2e2e2e2e2e2e;
    uRam000000000017f648 = 0x2e2e2e2e2e2e2e2e;
    _DAT_0017f630 = 0x2e2e2e2e2e2e2e2e;
    uRam000000000017f638 = 0x2e2e2e2e2e2e2e2e;
    _line = 0x2e2e2e2e2e2e2e2e;
    uRam000000000017f628 = 0x2e2e2e2e2e2e2e2e;
    DAT_0017f66f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void printClosedHeader( std::string const& _name ) {
            printOpenHeader( _name );
            stream << getLineOfChars<'.'>() << "\n";
        }